

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall GameBoard::eliminate(GameBoard *this,int color)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  long lVar6;
  
  this->transCount[color] = 0;
  this->maxHeight[color] = 0x14;
  piVar4 = this->gridInfo[color][1] + 1;
  lVar3 = 1;
  do {
    if (lVar3 == 0x15) {
      iVar2 = this->maxHeight[color];
LAB_001196ea:
      this->maxHeight[color] = iVar2 - this->transCount[color];
      this->elimTotal[color] = this->elimTotal[color] + elimBonus[this->transCount[color]];
      return;
    }
    bVar1 = true;
    bVar5 = bVar1;
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      if (piVar4[lVar6] == 0) {
        bVar1 = false;
      }
      else {
        bVar5 = false;
      }
    }
    if (bVar1) {
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        this->trans[color][this->transCount[color]][lVar6 + 1] = (uint)(piVar4[lVar6] == 1);
        piVar4[lVar6] = 0;
      }
      this->transCount[color] = this->transCount[color] + 1;
    }
    else {
      if (bVar5) {
        iVar2 = (int)lVar3 + -1;
        goto LAB_001196ea;
      }
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        iVar2 = piVar4[lVar6];
        if (0 < iVar2) {
          iVar2 = 1;
        }
        piVar4[lVar6 + (long)this->transCount[color] * -0xc] = iVar2;
        if (this->transCount[color] != 0) {
          piVar4[lVar6] = 0;
        }
      }
    }
    lVar3 = lVar3 + 1;
    piVar4 = piVar4 + 0xc;
  } while( true );
}

Assistant:

void GameBoard::eliminate(int color)
{
    int &count = transCount[color] = 0;
    int i, j, emptyFlag, fullFlag;
    maxHeight[color] = MAPHEIGHT;
    for (i = 1; i <= MAPHEIGHT; i++) {
        emptyFlag = 1;
        fullFlag = 1;
        for (j = 1; j <= MAPWIDTH; j++) {
            if (gridInfo[color][i][j] == 0)
                fullFlag = 0;
            else
                emptyFlag = 0;
        }
        if (fullFlag) {
            for (j = 1; j <= MAPWIDTH; j++) {
                // 注意这里只转移以前的块，不包括最后一次落下的块（“撤销最后一步”）
                trans[color][count][j] = gridInfo[color][i][j] == 1 ? 1 : 0;
                gridInfo[color][i][j] = 0;
            }
            count++;
        }
        else if (emptyFlag) {
            maxHeight[color] = i - 1;
            break;
        }
        else
            for (j = 1; j <= MAPWIDTH; j++) {
                gridInfo[color][i - count][j] =
                    gridInfo[color][i][j] > 0 ? 1 : gridInfo[color][i][j];
                if (count)
                    gridInfo[color][i][j] = 0;
            }
    }
    maxHeight[color] -= count;
    elimTotal[color] += elimBonus[count];
}